

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Program> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Program>(RecursiveDescentParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Program> sVar2;
  allocator local_61;
  string local_60 [48];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Program> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::Program>();
  parse<MyCompiler::Block>((RecursiveDescentParser *)local_30);
  peVar1 = std::__shared_ptr_access<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<MyCompiler::Block>::operator=
            (&peVar1->pBlock,(shared_ptr<MyCompiler::Block> *)local_30);
  std::shared_ptr<MyCompiler::Block>::~shared_ptr((shared_ptr<MyCompiler::Block> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"period expected",&local_61);
  except(in_RSI,PERIOD,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  sVar2.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Program>)
         sVar2.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Program> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Program>();

    pResult->pBlock = parse<Block>();
    except(SymbolType::PERIOD, "period expected");

    return pResult;
}